

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O2

ex_ex * ex_parse(expr *x,ex_ex *iptr,ex_ex *optr,long *argc)

{
  anon_union_8_5_735de1bb_for_ex_cont aVar1;
  long lVar2;
  ex_ex *peVar3;
  anon_union_8_5_735de1bb_for_ex_cont *paVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  anon_union_8_5_735de1bb_for_ex_cont *paVar9;
  anon_union_8_5_735de1bb_for_ex_cont aVar10;
  long ac;
  anon_union_8_5_735de1bb_for_ex_cont local_48;
  anon_union_8_5_735de1bb_for_ex_cont aStack_40;
  long local_38;
  
  if (iptr != (ex_ex *)0x0) {
    lVar7 = iptr->ex_type;
    if (lVar7 == 0) {
      return (ex_ex *)0x0;
    }
    uVar5 = 0x640000;
    lVar2 = 0;
    paVar4 = &iptr->ex_cont;
LAB_00188be0:
    paVar9 = paVar4;
    switch(lVar7) {
    case 1:
    case 2:
    case 0xb:
    case 0xc:
    case 0xe:
    case 0x11:
    case 0x14:
    case 0x15:
      goto switchD_00188bf1_caseD_1;
    case 3:
      if (*(t_float **)paVar4 == (t_float *)0x20002) {
        if (((argc == (long *)0x0) || (lVar2 == 0)) || (paVar4[4].v_int == 0)) {
          post("expr: syntax error: illegal comma\n");
          if (paVar4[4].v_int != 0) {
            iptr = (ex_ex *)paVar4;
          }
          goto LAB_00188e5c;
        }
      }
      else if (paVar4[4].v_int == 0) {
        post("expr: syntax error: missing operand\n");
        goto LAB_00188e5c;
      }
      uVar6 = (uint)SUB84(*(t_float **)paVar4,0) & 0xffff0000;
      if (uVar6 < uVar5) {
        uVar5 = uVar6;
      }
      break;
    default:
      goto switchD_00188bf1_caseD_4;
    case 5:
    case 0xd:
    case 0x10:
    case 0x12:
      if (paVar4[4].v_int != 10) {
        pcVar8 = "expr: syntax error: brackets missing\n";
LAB_00188d12:
        post(pcVar8);
        iptr = (ex_ex *)paVar4;
LAB_00188e5c:
        ex_print(iptr);
        return (ex_ex *)0x0;
      }
      paVar9 = (anon_union_8_5_735de1bb_for_ex_cont *)paVar4[3].v_vec;
      if ((lVar2 == 0) && (paVar9[4].v_int == 0)) {
        aVar10 = *paVar9;
        local_48 = paVar9[1];
        aStack_40 = paVar9[2];
        paVar9[2].v_vec = (t_float *)nullex.ex_end;
        lVar7 = nullex.ex_type;
        *paVar9 = nullex.ex_cont;
        paVar9[1].v_int = lVar7;
        optr->ex_end = (ex_ex *)paVar4[2];
        aVar1 = paVar4[1];
        (optr->ex_cont).v_vec = *(t_float **)paVar4;
        optr->ex_type = (long)aVar1;
        peVar3 = ex_parse(x,(ex_ex *)(paVar4 + 6),optr + 1,(long *)0x0);
LAB_00188d6b:
        paVar4 = (anon_union_8_5_735de1bb_for_ex_cont *)paVar4[3].v_vec;
        goto LAB_00188e21;
      }
      break;
    case 6:
      if (paVar4[4].v_int != 9) {
        post("expr: ex_parse: no parenthesis\n");
        return (ex_ex *)0x0;
      }
      paVar9 = (anon_union_8_5_735de1bb_for_ex_cont *)paVar4[3].v_vec;
      if ((lVar2 == 0) && (paVar9[4].v_int == 0)) {
        if (paVar9 != paVar4 + 6) {
          local_38 = 0;
          aVar10 = *paVar9;
          local_48 = paVar9[1];
          aStack_40 = paVar9[2];
          paVar9[2].v_vec = (t_float *)nullex.ex_end;
          lVar7 = nullex.ex_type;
          *paVar9 = nullex.ex_cont;
          paVar9[1].v_int = lVar7;
          optr->ex_end = (ex_ex *)paVar4[2];
          aVar1 = paVar4[1];
          (optr->ex_cont).v_vec = *(t_float **)paVar4;
          optr->ex_type = (long)aVar1;
          peVar3 = ex_parse(x,(ex_ex *)(paVar4 + 6),optr + 1,&local_38);
          if (peVar3 == (ex_ex *)0x0) {
            return (ex_ex *)0x0;
          }
          local_38 = local_38 + 1;
          if (local_38 != *(long *)(paVar4->v_vec + 4)) {
            post("expr: syntax error: function \'%s\' needs %ld arguments\n",
                 *(undefined8 *)paVar4->v_vec);
            return (ex_ex *)0x0;
          }
          goto LAB_00188d6b;
        }
        pcVar8 = "expr: syntax error: missing argument\n";
        goto LAB_00188d12;
      }
      break;
    case 7:
    case 8:
      if (argc == (long *)0x0) {
        pcVar8 = "expr: syntax error: symbols allowed for functions only\n";
        goto LAB_00188d12;
      }
      goto switchD_00188bf1_caseD_1;
    case 9:
    case 10:
      paVar9 = (anon_union_8_5_735de1bb_for_ex_cont *)paVar4->v_vec;
      if ((lVar2 == 0) && (paVar9[4].v_int == 0)) {
        if (paVar9 == paVar4 + 3) {
          pcVar8 = "[]";
          if (lVar7 == 9) {
            pcVar8 = "()";
          }
          post("expr: syntax error: empty \'%s\'\n",pcVar8);
          iptr = (ex_ex *)paVar4;
          goto LAB_00188e5c;
        }
        aVar10 = *paVar9;
        local_48 = paVar9[1];
        aStack_40 = paVar9[2];
        paVar9[2].v_vec = (t_float *)nullex.ex_end;
        lVar7 = nullex.ex_type;
        *paVar9 = nullex.ex_cont;
        paVar9[1].v_int = lVar7;
        peVar3 = ex_parse(x,(ex_ex *)(paVar4 + 3),optr,(long *)0x0);
        paVar4 = (anon_union_8_5_735de1bb_for_ex_cont *)paVar4->v_vec;
LAB_00188e21:
        *paVar4 = aVar10;
        paVar4[1] = local_48;
        paVar4[2] = aStack_40;
        goto LAB_00188e2c;
      }
    }
    goto LAB_00188cc8;
  }
  pcVar8 = "ex_parse: input is null, iptr = 0x%lx\n";
  lVar7 = 0;
  goto LAB_00188ce5;
switchD_00188bf1_caseD_1:
  if ((lVar2 == 0) && (paVar4[4].v_int == 0)) {
    aVar10 = paVar4[1];
    (optr->ex_cont).v_vec = *(t_float **)paVar4;
    optr->ex_type = (long)aVar10;
    peVar3 = optr + 1;
LAB_00188e2c:
    optr->ex_end = peVar3;
    return peVar3;
  }
LAB_00188cc8:
  lVar2 = lVar2 + 1;
  lVar7 = paVar9[4].v_int;
  paVar4 = paVar9 + 3;
  goto LAB_00188be0;
switchD_00188bf1_caseD_4:
  ex_print((ex_ex *)paVar4);
  lVar7 = paVar4[1].v_int;
  pcVar8 = "expr: ex_parse: type = 0x%lx\n";
LAB_00188ce5:
  post(pcVar8,lVar7);
  return (ex_ex *)0x0;
}

Assistant:

struct ex_ex *
ex_parse(struct expr *x, struct ex_ex *iptr, struct ex_ex *optr, long int *argc)
{
        struct ex_ex *eptr;
        struct ex_ex *lowpre = 0;       /* pointer to the lowest precedence */
        struct ex_ex savex = { 0 };
        struct ex_ex *tmpex;
        long pre = HI_PRE;
        long count;

        if (!iptr) {
                post("ex_parse: input is null, iptr = 0x%lx\n", iptr);
                return (exNULL);
        }
        if (!iptr->ex_type)
                return (exNULL);

        /*
         * the following loop finds the lowest precedence operator in the
         * the input token list, comma is explicitly checked here since
         * that is a special operator and is only legal in functions
         */
        for (eptr = iptr, count = 0; eptr->ex_type; eptr++, count++)
                switch (eptr->ex_type) {
                case ET_SYM:
                case ET_VSYM:
                        if (!argc) {
                                post("expr: syntax error: symbols allowed for functions only\n");
                                ex_print(eptr);
                                return (exNULL);
                        }   /* falls through */
                case ET_INT:
                case ET_FLT:
                case ET_II:
                case ET_FI:
                case ET_XI0:
                case ET_YOM1:
                case ET_VI:
                case ET_VAR:
                        if (!count && !eptr[1].ex_type) {
                                *optr = *eptr;
                                                                tmpex = optr;
                                                                tmpex->ex_end = ++optr;
                                return (optr);
                        }
                        break;
                case ET_XI:
                case ET_YO:
                case ET_SI:
                case ET_TBL:
                        if (eptr[1].ex_type != ET_LB) {
                                post("expr: syntax error: brackets missing\n");
                                ex_print(eptr);
                                return (exNULL);
                        }
                        /* if this table is the only token, parse the table */
                        if (!count &&
                            !((struct ex_ex *) eptr[1].ex_ptr)[1].ex_type) {
                                savex = *((struct ex_ex *) eptr[1].ex_ptr);
                                *((struct ex_ex *) eptr[1].ex_ptr) = nullex;
                                *optr = *eptr;
                                lowpre = ex_parse(x, &eptr[2], optr + 1, (long *)0);
                                *((struct ex_ex *) eptr[1].ex_ptr) = savex;
                                                                optr->ex_end = lowpre;
                                return(lowpre);
                        }
                        eptr = (struct ex_ex *) eptr[1].ex_ptr;
                        break;
                case ET_OP:
                        if (eptr->ex_op == OP_COMMA) {
                                if (!argc || !count || !eptr[1].ex_type) {
                                        post("expr: syntax error: illegal comma\n");
                                        ex_print(eptr[1].ex_type ? eptr : iptr);
                                        return (exNULL);
                                }
                        }
                        if (!eptr[1].ex_type) {
                                post("expr: syntax error: missing operand\n");
                                ex_print(iptr);
                                return (exNULL);
                        }
                        if ((eptr->ex_op & PRE_MASK) <= pre) {
                                pre = eptr->ex_op & PRE_MASK;
                                lowpre = eptr;
                        }
                        break;
                case ET_FUNC:
                        if (eptr[1].ex_type != ET_LP) {
                                post("expr: ex_parse: no parenthesis\n");
                                return (exNULL);
                        }
                        /* if this function is the only token, parse it */
                        if (!count &&
                            !((struct ex_ex *) eptr[1].ex_ptr)[1].ex_type) {
                                long ac;

                                if (eptr[1].ex_ptr == (char *) &eptr[2]) {
                                        post("expr: syntax error: missing argument\n");
                                        ex_print(eptr);
                                        return (exNULL);
                                }
                                ac = 0;
                                savex = *((struct ex_ex *) eptr[1].ex_ptr);
                                *((struct ex_ex *) eptr[1].ex_ptr) = nullex;
                                *optr = *eptr;
                                lowpre = ex_parse(x, &eptr[2], optr + 1, &ac);
                                if (!lowpre)
                                        return (exNULL);
                                ac++;
                                if (ac !=
                                    ((t_ex_func *)eptr->ex_ptr)->f_argc){
                                        post("expr: syntax error: function '%s' needs %ld arguments\n",
                                            ((t_ex_func *)eptr->ex_ptr)->f_name,
                                            ((t_ex_func *)eptr->ex_ptr)->f_argc);
                                        return (exNULL);
                                }
                                *((struct ex_ex *) eptr[1].ex_ptr) = savex;
                                                                optr->ex_end = lowpre;
                                return (lowpre);
                        }
                        eptr = (struct ex_ex *) eptr[1].ex_ptr;
                        break;
                case ET_LP:
                case ET_LB:
                        if (!count &&
                            !((struct ex_ex *) eptr->ex_ptr)[1].ex_type) {
                                if (eptr->ex_ptr == (char *)(&eptr[1])) {
                                        post("expr: syntax error: empty '%s'\n",
                                            eptr->ex_type==ET_LP?"()":"[]");
                                        ex_print(eptr);
                                        return (exNULL);
                                }
                                savex = *((struct ex_ex *) eptr->ex_ptr);
                                *((struct ex_ex *) eptr->ex_ptr) = nullex;
                                lowpre = ex_parse(x, &eptr[1], optr, (long *)0);
                                *((struct ex_ex *) eptr->ex_ptr) = savex;
                                                                optr->ex_end = lowpre;
                                return (lowpre);
                        }
                        eptr = (struct ex_ex *)eptr->ex_ptr;
                        break;
                case ET_STR:
                default:
                        ex_print(eptr);
                        post("expr: ex_parse: type = 0x%lx\n", eptr->ex_type);
                        return (exNULL);
                }

        if (pre == HI_PRE) {
                post("expr: syntax error: missing operation\n");
                ex_print(iptr);
                return (exNULL);
        }
        if (count < 2) {
                post("expr: syntax error: mission operand\n");
                ex_print(iptr);
                return (exNULL);
        }
        if (count == 2) {
                if (lowpre != iptr) {
                        post("expr: ex_parse: unary operator should be first\n");
                        return (exNULL);
                }
                if (!unary_op(lowpre->ex_op)) {
                        post("expr: syntax error: not a uniary operator\n");
                        ex_print(iptr);
                        return (exNULL);
                }
                *optr = *lowpre;
                eptr = ex_parse(x, &lowpre[1], optr + 1, argc);
                                optr->ex_end = eptr;
                return (eptr);
        }
        /* this is the case of using unary operator as a binary opetator */
        if (count == 3 && unary_op(lowpre->ex_op)) {
                post("expr: syntax error, missing operand before unary operator\n");
                ex_print(iptr);
                return (exNULL);
        }
        if (lowpre == iptr) {
                post("expr: syntax error: mission operand\n");
                ex_print(iptr);
                return (exNULL);
        }
        savex = *lowpre;
        *lowpre = nullex;
        if (savex.ex_op != OP_COMMA) {
            *optr = savex;
                eptr = ex_parse(x, iptr, optr + 1, argc);
                } else {
            (*argc)++;
                eptr = ex_parse(x, iptr, optr, argc);
                }
        if (eptr) {
                eptr = ex_parse(x, &lowpre[1], eptr, argc);
                *lowpre = savex;
        }
                optr->ex_end = eptr;
        return (eptr);
}